

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O3

void __thiscall Assimp::anon_unknown_0::ChunkWriter::~ChunkWriter(ChunkWriter *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = this->chunk_start_pos;
  sVar2 = this->writer->cursor;
  this->writer->cursor = sVar1 + 2;
  StreamWriter<false,_false>::Put<unsigned_int>(this->writer,(int)sVar2 - (int)sVar1);
  this->writer->cursor = sVar2;
  return;
}

Assistant:

~ChunkWriter() {
            std::size_t head_pos = writer.GetCurrentPos();

            ai_assert(head_pos > chunk_start_pos);
            const std::size_t chunk_size = head_pos - chunk_start_pos;

            writer.SetCurrentPos(chunk_start_pos + SIZE_OFFSET);
            writer.PutU4(static_cast<uint32_t>(chunk_size));
            writer.SetCurrentPos(head_pos);
        }